

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_GetEndpoints
               (UA_Server *server,UA_Session *session,UA_GetEndpointsRequest *request,
               UA_GetEndpointsResponse *response)

{
  UA_EndpointDescription *pUVar1;
  long lVar2;
  UA_GetEndpointsResponse *pUVar3;
  UA_GetEndpointsRequest *src;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  size_t j;
  UA_EndpointDescription *pUVar7;
  long lVar8;
  size_t sVar9;
  UA_String *s1;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  size_t j_1;
  size_t sVar14;
  ulong uVar15;
  undefined1 *__s;
  size_t sStack_90;
  undefined1 auStack_88 [8];
  size_t local_80;
  size_t local_78;
  size_t *local_70;
  size_t local_68;
  long local_60;
  UA_GetEndpointsResponse *local_58;
  undefined1 *local_50;
  size_t local_48;
  UA_GetEndpointsRequest *local_40;
  UA_Server *local_38;
  
  local_68 = (request->endpointUrl).length;
  sVar13 = server->endpointDescriptionsSize;
  lVar2 = -(sVar13 + 0xf & 0xfffffffffffffff0);
  __s = auStack_88 + lVar2;
  local_38 = server;
  *(undefined8 *)((long)&sStack_90 + lVar2) = 0x11aed9;
  memset(__s,0,sVar13);
  local_40 = request;
  local_58 = response;
  local_50 = __s;
  if (request->profileUrisSize == 0) {
    for (sVar14 = 0; sVar11 = sVar13, sVar13 != sVar14; sVar14 = sVar14 + 1) {
      __s[sVar14] = 1;
    }
  }
  else {
    local_60 = request->profileUrisSize + 1;
    sVar11 = 0;
    for (sVar14 = 0; response = local_58, __s = local_50, sVar14 != sVar13; sVar14 = sVar14 + 1) {
      local_48 = sVar11;
      pUVar7 = local_38->endpointDescriptions;
      s1 = local_40->profileUris;
      lVar12 = local_60;
      do {
        lVar12 = lVar12 + -1;
        sVar11 = local_48;
        if (lVar12 == 0) goto LAB_0011af5e;
        *(undefined8 *)((long)&sStack_90 + lVar2) = 0x11af41;
        UVar4 = UA_String_equal(s1,&pUVar7[sVar14].transportProfileUri);
        s1 = s1 + 1;
      } while (!UVar4);
      local_50[sVar14] = 1;
      sVar11 = local_48 + 1;
LAB_0011af5e:
    }
  }
  if (sVar11 == 0) {
    response->endpointsSize = 0;
  }
  else {
    if (local_68 == 0) {
      sVar9 = (local_38->config).networkLayersSize;
    }
    else {
      *(undefined8 *)((long)&sStack_90 + lVar2) = 1;
      sVar9 = *(size_t *)((long)&sStack_90 + lVar2);
    }
    *(undefined8 *)((long)&sStack_90 + lVar2) = 0x11afbd;
    pUVar7 = (UA_EndpointDescription *)UA_Array_new(sVar11 * sVar9,UA_TYPES + 0x9b);
    response->endpoints = pUVar7;
    if (pUVar7 == (UA_EndpointDescription *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      local_40 = (UA_GetEndpointsRequest *)&local_40->endpointUrl;
      local_70 = &response->endpointsSize;
      response->endpointsSize = sVar11 * sVar9;
      lVar12 = 0;
      UVar5 = 0;
      local_78 = sVar9;
      for (sVar10 = 0; sVar10 != sVar9; sVar10 = sVar10 + 1) {
        if (local_68 == 0) {
          local_40 = (UA_GetEndpointsRequest *)
                     &(local_38->config).networkLayers[sVar10].discoveryUrl;
        }
        lVar8 = 0;
        local_80 = sVar10;
        for (uVar15 = 0; pUVar3 = local_58, uVar15 < sVar13; uVar15 = uVar15 + 1) {
          if (__s[uVar15] == '\x01') {
            pUVar7 = local_38->endpointDescriptions;
            local_48 = CONCAT44(local_48._4_4_,UVar5);
            pUVar1 = local_58->endpoints;
            local_60 = lVar8;
            *(undefined8 *)((long)&sStack_90 + lVar2) = 0x11b065;
            UVar5 = UA_copy((void *)((long)&(pUVar7->endpointUrl).length + lVar8),pUVar1 + lVar12,
                            UA_TYPES + 0x9b);
            src = local_40;
            __s = local_50;
            sVar9 = local_78;
            pUVar7 = pUVar3->endpoints;
            *(undefined8 *)((long)&sStack_90 + lVar2) = 0x11b083;
            UVar6 = UA_String_copy((UA_String *)src,&pUVar7[lVar12].endpointUrl);
            UVar5 = (uint)local_48 | UVar6 | UVar5;
            lVar12 = lVar12 + 1;
            sVar13 = local_38->endpointDescriptionsSize;
            lVar8 = local_60;
            sVar10 = local_80;
          }
          lVar8 = lVar8 + 0xd8;
        }
        response = local_58;
      }
      if (UVar5 != 0) {
        (response->responseHeader).serviceResult = UVar5;
        sVar13 = response->endpointsSize;
        pUVar7 = response->endpoints;
        *(undefined8 *)((long)&sStack_90 + lVar2) = 0x11b0da;
        UA_Array_delete(pUVar7,sVar13,UA_TYPES + 0x9b);
        *local_70 = 0;
        local_70[1] = 0;
      }
    }
  }
  return;
}

Assistant:

void Service_GetEndpoints(UA_Server *server, UA_Session *session, const UA_GetEndpointsRequest *request,
                          UA_GetEndpointsResponse *response) {
    /* If the client expects to see a specific endpointurl, mirror it back. If
       not, clone the endpoints with the discovery url of all networklayers. */
    const UA_String *endpointUrl = &request->endpointUrl;
    if(endpointUrl->length > 0) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with endpointUrl " \
                             UA_PRINTF_STRING_FORMAT, UA_PRINTF_STRING_DATA(*endpointUrl));
    } else {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with an empty endpointUrl");
    }

    /* test if the supported binary profile shall be returned */
#ifdef NO_ALLOCA
    UA_Boolean relevant_endpoints[server->endpointDescriptionsSize];
#else
    UA_Boolean *relevant_endpoints = UA_alloca(sizeof(UA_Boolean) * server->endpointDescriptionsSize);
#endif
    memset(relevant_endpoints, 0, sizeof(UA_Boolean) * server->endpointDescriptionsSize);
    size_t relevant_count = 0;
    if(request->profileUrisSize == 0) {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j)
            relevant_endpoints[j] = true;
        relevant_count = server->endpointDescriptionsSize;
    } else {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            for(size_t i = 0; i < request->profileUrisSize; ++i) {
                if(!UA_String_equal(&request->profileUris[i], &server->endpointDescriptions[j].transportProfileUri))
                    continue;
                relevant_endpoints[j] = true;
                ++relevant_count;
                break;
            }
        }
    }

    if(relevant_count == 0) {
        response->endpointsSize = 0;
        return;
    }

    /* Clone the endpoint for each networklayer? */
    size_t clone_times = 1;
    UA_Boolean nl_endpointurl = false;
    if(endpointUrl->length == 0) {
        clone_times = server->config.networkLayersSize;
        nl_endpointurl = true;
    }

    response->endpoints = UA_Array_new(relevant_count * clone_times, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(!response->endpoints) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->endpointsSize = relevant_count * clone_times;

    size_t k = 0;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(size_t i = 0; i < clone_times; ++i) {
        if(nl_endpointurl)
            endpointUrl = &server->config.networkLayers[i].discoveryUrl;
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            if(!relevant_endpoints[j])
                continue;
            retval |= UA_EndpointDescription_copy(&server->endpointDescriptions[j], &response->endpoints[k]);
            retval |= UA_String_copy(endpointUrl, &response->endpoints[k].endpointUrl);
            ++k;
        }
    }

    if(retval != UA_STATUSCODE_GOOD) {
        response->responseHeader.serviceResult = retval;
        UA_Array_delete(response->endpoints, response->endpointsSize, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
        response->endpoints = NULL;
        response->endpointsSize = 0;
        return;
    }
}